

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if.c
# Opt level: O0

int pigpio_start(char *addrStr,char *portStr)

{
  size_t sVar1;
  char *in_RDI;
  void *in_stack_00000020;
  gpioThreadFunc_t *in_stack_00000028;
  char *in_stack_00000040;
  char *in_stack_00000048;
  int in_stack_fffffffffffffff8;
  int in_stack_fffffffffffffffc;
  int iVar2;
  
  if ((in_RDI == (char *)0x0) || (sVar1 = strlen(in_RDI), sVar1 == 0)) {
    in_RDI = "localhost";
  }
  if (gPigStarted == 0) {
    gPigCommand = pigpioOpenSocket(in_stack_00000048,in_stack_00000040);
    iVar2 = gPigCommand;
    if (-1 < gPigCommand) {
      gPigNotify = pigpioOpenSocket(in_stack_00000048,in_stack_00000040);
      iVar2 = gPigNotify;
      if (-1 < gPigNotify) {
        gPigHandle = pigpio_command((int)portStr,in_stack_fffffffffffffffc,in_stack_fffffffffffffff8
                                    ,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
        if (gPigHandle < 0) {
          iVar2 = -0x7d5;
        }
        else {
          gLastLevel = read_bank_1();
          pthNotify = start_thread(in_stack_00000028,in_stack_00000020);
          if (pthNotify == (pthread_t *)0x0) {
            iVar2 = -0x7d9;
          }
          else {
            gPigStarted = 1;
            iVar2 = 0;
          }
        }
      }
    }
  }
  else {
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int pigpio_start(char *addrStr, char *portStr)
{
   if ((!addrStr) || (strlen(addrStr) == 0))
   {
      addrStr = "localhost";
   }

   if (!gPigStarted)
   {
      gPigCommand = pigpioOpenSocket(addrStr, portStr);

      if (gPigCommand >= 0)
      {
         gPigNotify = pigpioOpenSocket(addrStr, portStr);

         if (gPigNotify >= 0)
         {
            gPigHandle = pigpio_command(gPigNotify, PI_CMD_NOIB, 0, 0, 1);

            if (gPigHandle < 0) return pigif_bad_noib;
            else
            {
               gLastLevel = read_bank_1();

               pthNotify = start_thread(pthNotifyThread, 0);
               if (pthNotify)
               {
                  gPigStarted = 1;
                  return 0;
               }
               else return pigif_notify_failed;
            }
         }
         else return gPigNotify;
      }
      else return gPigCommand;
   }
   return 0;
}